

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Coap::SendHeaderResponse
          (Error *__return_storage_ptr__,Coap *this,Code aCode,Request *aRequest)

{
  Type TVar1;
  uint16_t uVar2;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  ErrorCode local_1f4;
  Error local_1f0;
  anon_class_1_0_00000001 local_1c2;
  v10 local_1c1;
  v10 *local_1c0;
  size_t local_1b8;
  string local_1b0;
  Error local_190;
  undefined1 local_158 [8];
  Response response;
  Request *aRequest_local;
  Code aCode_local;
  Coap *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  response.mEndpoint._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  Message::Message((Message *)local_158);
  TVar1 = Message::GetType(aRequest);
  if (TVar1 == kConfirmable) {
    Message::SetType((Message *)local_158,kAcknowledgment);
    Message::SetCode((Message *)local_158,aCode);
    uVar2 = Message::GetMessageId(aRequest);
    Message::SetMessageId((Message *)local_158,uVar2);
  }
  else {
    if (TVar1 != kNonConfirmable) {
      SendHeaderResponse::anon_class_1_0_00000001::operator()(&local_1c2);
      local_58 = &local_1c0;
      local_60 = &local_1c1;
      bVar3 = ::fmt::v10::operator()(local_60);
      local_1b8 = bVar3.size_;
      local_1c0 = (v10 *)bVar3.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_68 = &local_1b0;
      local_78 = local_1c0;
      sStack_70 = local_1b8;
      local_50 = &local_78;
      local_88 = local_1c0;
      local_80 = local_1b8;
      local_48 = local_88;
      sStack_40 = local_80;
      error = (Error *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_30 = local_98;
      local_38 = &error;
      local_20 = 0;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_80;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_1b0,local_88,fmt,args);
      Error::Error(&local_190,kInvalidArgs,&local_1b0);
      Error::operator=(__return_storage_ptr__,&local_190);
      Error::~Error(&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      goto LAB_002edfe4;
    }
    Message::SetType((Message *)local_158,kNonConfirmable);
    Message::SetCode((Message *)local_158,aCode);
    uVar2 = AllocMessageId(this);
    Message::SetMessageId((Message *)local_158,uVar2);
  }
  SendResponse(&local_1f0,this,aRequest,(Response *)local_158);
  aError = Error::operator=(__return_storage_ptr__,&local_1f0);
  local_1f4 = kNone;
  commissioner::operator!=(aError,&local_1f4);
  Error::~Error(&local_1f0);
LAB_002edfe4:
  response.mEndpoint._7_1_ = 1;
  Message::~Message((Message *)local_158);
  if ((response.mEndpoint._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Coap::SendHeaderResponse(Code aCode, const Request &aRequest)
{
    Error    error;
    Response response;

    switch (aRequest.GetType())
    {
    case Type::kConfirmable:
        response.SetType(Type::kAcknowledgment);
        response.SetCode(aCode);
        response.SetMessageId(aRequest.GetMessageId());
        break;

    case Type::kNonConfirmable:
        response.SetType(Type::kNonConfirmable);
        response.SetCode(aCode);
        response.SetMessageId(AllocMessageId());
        break;

    default:
        ExitNow(error = ERROR_INVALID_ARGS("a CoAP request is neither Confirmable nor NON-Confirmable"));
        break;
    }

    SuccessOrExit(error = SendResponse(aRequest, response));

exit:
    return error;
}